

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (this->m_arith_total_bits != 0) {
    bVar6 = 0x2000000 < this->m_arith_length;
    uVar5 = 0x8000;
    if (bVar6) {
      uVar5 = 0x800000;
    }
    uVar3 = (uint)bVar6 * 0x800000 + 0x800000;
    puVar1 = &this->m_arith_base;
    uVar4 = *puVar1;
    *puVar1 = *puVar1 + uVar3;
    this->m_arith_length = uVar5;
    if (CARRY4(uVar4,uVar3)) {
      uVar4 = (this->m_arith_output_buf).m_size;
      while (uVar4 = uVar4 - 1, -1 < (int)uVar4) {
        puVar2 = (this->m_arith_output_buf).m_p;
        if (puVar2[uVar4] != 0xff) {
          puVar2[uVar4] = puVar2[uVar4] + '\x01';
          break;
        }
        puVar2[uVar4] = '\0';
      }
    }
    arith_renorm_enc_interval(this);
    uVar4 = (this->m_arith_output_buf).m_size;
    if (uVar4 < 4) {
      do {
        if ((this->m_arith_output_buf).m_capacity <= uVar4) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_arith_output_buf,uVar4 + 1,true,1,
                     (object_mover)0x0,false);
        }
        (this->m_arith_output_buf).m_p[(this->m_arith_output_buf).m_size] = '\0';
        uVar4 = (this->m_arith_output_buf).m_size + 1;
        (this->m_arith_output_buf).m_size = uVar4;
        this->m_total_bits_written = this->m_total_bits_written + 8;
      } while (uVar4 < 4);
    }
  }
  return;
}

Assistant:

void symbol_codec::arith_stop_encoding()
    {
        if (!m_arith_total_bits)
        {
            return;
        }

        uint orig_base = m_arith_base;

        if (m_arith_length > 2 * cSymbolCodecArithMinLen)
        {
            m_arith_base += cSymbolCodecArithMinLen;
            m_arith_length = (cSymbolCodecArithMinLen >> 1);
        }
        else
        {
            m_arith_base += (cSymbolCodecArithMinLen >> 1);
            m_arith_length = (cSymbolCodecArithMinLen >> 9);
        }

        if (orig_base > m_arith_base)
        {
            arith_propagate_carry();
        }

        arith_renorm_enc_interval();

        while (m_arith_output_buf.size() < 4)
        {
            m_arith_output_buf.push_back(0);
            m_total_bits_written += 8;
        }
    }